

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

HasbitMode google::protobuf::internal::cpp::GetFieldHasbitMode(FieldDescriptor *field)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  FieldOptions *this;
  FieldDescriptor *field_local;
  
  pOVar2 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar2 == (OneofDescriptor *)0x0) {
    this = FieldDescriptor::options(field);
    bVar1 = FieldOptions::weak(this);
    if ((!bVar1) && (bVar1 = FieldDescriptor::is_extension(field), !bVar1)) {
      bVar1 = FieldDescriptor::has_presence(field);
      if (bVar1) {
        return kTrueHasbit;
      }
      bVar1 = FieldDescriptor::is_repeated(field);
      if (!bVar1) {
        return kHintHasbit;
      }
      return kNoHasbit;
    }
  }
  return kNoHasbit;
}

Assistant:

HasbitMode GetFieldHasbitMode(const FieldDescriptor* field) {
  // Do not generate hasbits for "real-oneof", weak, or extension fields.
  if (field->real_containing_oneof() || field->options().weak() ||
      field->is_extension()) {
    return HasbitMode::kNoHasbit;
  }

  // Explicit-presence fields always have true hasbits.
  if (field->has_presence()) {
    return HasbitMode::kTrueHasbit;
  }

  // Implicit presence fields.
  if (!field->is_repeated()) {
    return HasbitMode::kHintHasbit;
  }
  // We currently don't implement hasbits for implicit repeated fields.
  return HasbitMode::kNoHasbit;
}